

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void iadst16_sse2(__m128i *input,__m128i *output)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  __m128i alVar8;
  longlong lVar9;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  int32_t *cospi;
  int8_t cos_bit;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar97 [16];
  __m128i alVar98;
  __m128i alVar99;
  __m128i alVar100;
  undefined2 local_138;
  undefined2 uStack_136;
  undefined2 uStack_134;
  undefined2 uStack_132;
  undefined2 uStack_130;
  undefined2 uStack_12e;
  undefined2 uStack_12c;
  undefined2 uStack_12a;
  __m128i local_118;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar94 [16];
  undefined1 auVar89 [16];
  undefined1 auVar95 [16];
  undefined1 auVar90 [16];
  undefined1 auVar96 [16];
  
  alVar98 = input[0xf];
  alVar99 = input[0xd];
  alVar100 = input[0xb];
  alVar1 = input[9];
  alVar2 = input[7];
  alVar3 = input[5];
  lVar4 = input[1][0];
  lVar5 = input[1][1];
  alVar8 = input[1];
  auVar90._0_12_ = alVar98._0_12_;
  auVar90._12_2_ = alVar98[0]._6_2_;
  auVar90._14_2_ = *(undefined2 *)((long)*input + 6);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._0_10_ = alVar98._0_10_;
  auVar89._10_2_ = *(undefined2 *)((long)*input + 4);
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._0_8_ = alVar98[0];
  auVar88._8_2_ = alVar98[0]._4_2_;
  auVar87._8_8_ = auVar88._8_8_;
  auVar87._6_2_ = *(undefined2 *)((long)*input + 2);
  auVar87._4_2_ = alVar98[0]._2_2_;
  auVar87._0_2_ = (undefined2)alVar98[0];
  auVar87._2_2_ = (short)(*input)[0];
  auVar25._2_2_ = (short)(*input)[1];
  auVar25._0_2_ = (short)alVar98[1];
  auVar25._4_2_ = alVar98[1]._2_2_;
  auVar25._6_2_ = *(undefined2 *)((long)*input + 10);
  auVar25._8_2_ = alVar98[1]._4_2_;
  auVar25._10_2_ = *(undefined2 *)((long)*input + 0xc);
  auVar25._12_2_ = alVar98[1]._6_2_;
  auVar25._14_2_ = *(undefined2 *)((long)*input + 0xe);
  auVar36._8_4_ = 0xc90ffb;
  auVar36._0_8_ = 0xc90ffb00c90ffb;
  auVar36._12_4_ = 0xc90ffb;
  auVar10 = pmaddwd(auVar87,auVar36);
  auVar37 = pmaddwd(auVar36,auVar25);
  auVar24._8_4_ = 0xf00500c9;
  auVar24._0_8_ = 0xf00500c9f00500c9;
  auVar24._12_4_ = 0xf00500c9;
  auVar91 = pmaddwd(auVar87,auVar24);
  auVar26 = pmaddwd(auVar25,auVar24);
  auVar79._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar79._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar79._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar79._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  auVar38._0_4_ = auVar37._0_4_ + 0x800 >> 0xc;
  auVar38._4_4_ = auVar37._4_4_ + 0x800 >> 0xc;
  auVar38._8_4_ = auVar37._8_4_ + 0x800 >> 0xc;
  auVar38._12_4_ = auVar37._12_4_ + 0x800 >> 0xc;
  local_118 = (__m128i)packssdw(auVar79,auVar38);
  alVar98 = input[3];
  auVar92._0_4_ = auVar91._0_4_ + 0x800 >> 0xc;
  auVar92._4_4_ = auVar91._4_4_ + 0x800 >> 0xc;
  auVar92._8_4_ = auVar91._8_4_ + 0x800 >> 0xc;
  auVar92._12_4_ = auVar91._12_4_ + 0x800 >> 0xc;
  auVar27._0_4_ = auVar26._0_4_ + 0x800 >> 0xc;
  auVar27._4_4_ = auVar26._4_4_ + 0x800 >> 0xc;
  auVar27._8_4_ = auVar26._8_4_ + 0x800 >> 0xc;
  auVar27._12_4_ = auVar26._12_4_ + 0x800 >> 0xc;
  local_108 = packssdw(auVar92,auVar27);
  lVar6 = input[0xe][0];
  lVar7 = input[0xe][1];
  auVar96._0_12_ = alVar99._0_12_;
  auVar96._12_2_ = alVar99[0]._6_2_;
  auVar96._14_2_ = *(undefined2 *)((long)input[2] + 6);
  auVar95._12_4_ = auVar96._12_4_;
  auVar95._0_10_ = alVar99._0_10_;
  auVar95._10_2_ = *(undefined2 *)((long)input[2] + 4);
  auVar94._10_6_ = auVar95._10_6_;
  auVar94._0_8_ = alVar99[0];
  auVar94._8_2_ = alVar99[0]._4_2_;
  auVar93._8_8_ = auVar94._8_8_;
  auVar93._6_2_ = *(undefined2 *)((long)input[2] + 2);
  auVar93._4_2_ = alVar99[0]._2_2_;
  auVar93._0_2_ = (undefined2)alVar99[0];
  auVar93._2_2_ = (short)input[2][0];
  auVar78._2_2_ = (short)input[2][1];
  auVar78._0_2_ = (short)alVar99[1];
  auVar78._4_2_ = alVar99[1]._2_2_;
  auVar78._6_2_ = *(undefined2 *)((long)input[2] + 10);
  auVar78._8_2_ = alVar99[1]._4_2_;
  auVar78._10_2_ = *(undefined2 *)((long)input[2] + 0xc);
  auVar78._12_2_ = alVar99[1]._6_2_;
  auVar78._14_2_ = *(undefined2 *)((long)input[2] + 0xe);
  auVar10._8_4_ = 0x3e30f85;
  auVar10._0_8_ = 0x3e30f8503e30f85;
  auVar10._12_4_ = 0x3e30f85;
  auVar26 = pmaddwd(auVar93,auVar10);
  auVar10 = pmaddwd(auVar10,auVar78);
  auVar28._8_4_ = 0xf07b03e3;
  auVar28._0_8_ = 0xf07b03e3f07b03e3;
  auVar28._12_4_ = 0xf07b03e3;
  auVar37 = pmaddwd(auVar93,auVar28);
  auVar79 = pmaddwd(auVar78,auVar28);
  auVar86._0_4_ = auVar26._0_4_ + 0x800 >> 0xc;
  auVar86._4_4_ = auVar26._4_4_ + 0x800 >> 0xc;
  auVar86._8_4_ = auVar26._8_4_ + 0x800 >> 0xc;
  auVar86._12_4_ = auVar26._12_4_ + 0x800 >> 0xc;
  auVar26._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar26._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar26._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar26._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  local_f8 = packssdw(auVar86,auVar26);
  auVar97._0_4_ = auVar37._0_4_ + 0x800 >> 0xc;
  auVar97._4_4_ = auVar37._4_4_ + 0x800 >> 0xc;
  auVar97._8_4_ = auVar37._8_4_ + 0x800 >> 0xc;
  auVar97._12_4_ = auVar37._12_4_ + 0x800 >> 0xc;
  auVar80._0_4_ = auVar79._0_4_ + 0x800 >> 0xc;
  auVar80._4_4_ = auVar79._4_4_ + 0x800 >> 0xc;
  auVar80._8_4_ = auVar79._8_4_ + 0x800 >> 0xc;
  auVar80._12_4_ = auVar79._12_4_ + 0x800 >> 0xc;
  local_e8 = packssdw(auVar97,auVar80);
  auVar84._0_12_ = alVar100._0_12_;
  auVar84._12_2_ = alVar100[0]._6_2_;
  auVar84._14_2_ = *(undefined2 *)((long)input[4] + 6);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._0_10_ = alVar100._0_10_;
  auVar83._10_2_ = *(undefined2 *)((long)input[4] + 4);
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._0_8_ = alVar100[0];
  auVar82._8_2_ = alVar100[0]._4_2_;
  auVar81._8_8_ = auVar82._8_8_;
  auVar81._6_2_ = *(undefined2 *)((long)input[4] + 2);
  auVar81._4_2_ = alVar100[0]._2_2_;
  auVar81._0_2_ = (undefined2)alVar100[0];
  auVar81._2_2_ = (short)input[4][0];
  auVar70._2_2_ = (short)input[4][1];
  auVar70._0_2_ = (short)alVar100[1];
  auVar70._4_2_ = alVar100[1]._2_2_;
  auVar70._6_2_ = *(undefined2 *)((long)input[4] + 10);
  auVar70._8_2_ = alVar100[1]._4_2_;
  auVar70._10_2_ = *(undefined2 *)((long)input[4] + 0xc);
  auVar70._12_2_ = alVar100[1]._6_2_;
  auVar70._14_2_ = *(undefined2 *)((long)input[4] + 0xe);
  auVar37._8_4_ = 0x6d70e77;
  auVar37._0_8_ = 0x6d70e7706d70e77;
  auVar37._12_4_ = 0x6d70e77;
  auVar26 = pmaddwd(auVar81,auVar37);
  auVar10 = pmaddwd(auVar37,auVar70);
  auVar29._8_4_ = 0xf18906d7;
  auVar29._0_8_ = 0xf18906d7f18906d7;
  auVar29._12_4_ = 0xf18906d7;
  auVar37 = pmaddwd(auVar81,auVar29);
  auVar79 = pmaddwd(auVar70,auVar29);
  auVar77._0_4_ = auVar26._0_4_ + 0x800 >> 0xc;
  auVar77._4_4_ = auVar26._4_4_ + 0x800 >> 0xc;
  auVar77._8_4_ = auVar26._8_4_ + 0x800 >> 0xc;
  auVar77._12_4_ = auVar26._12_4_ + 0x800 >> 0xc;
  auVar91._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar91._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar91._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar91._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  local_d8 = packssdw(auVar77,auVar91);
  auVar85._0_4_ = auVar37._0_4_ + 0x800 >> 0xc;
  auVar85._4_4_ = auVar37._4_4_ + 0x800 >> 0xc;
  auVar85._8_4_ = auVar37._8_4_ + 0x800 >> 0xc;
  auVar85._12_4_ = auVar37._12_4_ + 0x800 >> 0xc;
  auVar71._0_4_ = auVar79._0_4_ + 0x800 >> 0xc;
  auVar71._4_4_ = auVar79._4_4_ + 0x800 >> 0xc;
  auVar71._8_4_ = auVar79._8_4_ + 0x800 >> 0xc;
  auVar71._12_4_ = auVar79._12_4_ + 0x800 >> 0xc;
  local_c8 = packssdw(auVar85,auVar71);
  auVar75._0_12_ = alVar1._0_12_;
  auVar75._12_2_ = alVar1[0]._6_2_;
  auVar75._14_2_ = *(undefined2 *)((long)input[6] + 6);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._0_10_ = alVar1._0_10_;
  auVar74._10_2_ = *(undefined2 *)((long)input[6] + 4);
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._0_8_ = alVar1[0];
  auVar73._8_2_ = alVar1[0]._4_2_;
  auVar72._8_8_ = auVar73._8_8_;
  auVar72._6_2_ = *(undefined2 *)((long)input[6] + 2);
  auVar72._4_2_ = alVar1[0]._2_2_;
  auVar72._0_2_ = (undefined2)alVar1[0];
  auVar72._2_2_ = (short)input[6][0];
  auVar62._2_2_ = (short)input[6][1];
  auVar62._0_2_ = (short)alVar1[1];
  auVar62._4_2_ = alVar1[1]._2_2_;
  auVar62._6_2_ = *(undefined2 *)((long)input[6] + 10);
  auVar62._8_2_ = alVar1[1]._4_2_;
  auVar62._10_2_ = *(undefined2 *)((long)input[6] + 0xc);
  auVar62._12_2_ = alVar1[1]._6_2_;
  auVar62._14_2_ = *(undefined2 *)((long)input[6] + 0xe);
  auVar11._8_4_ = 0x9880cda;
  auVar11._0_8_ = 0x9880cda09880cda;
  auVar11._12_4_ = 0x9880cda;
  auVar26 = pmaddwd(auVar72,auVar11);
  auVar10 = pmaddwd(auVar11,auVar62);
  auVar30._8_4_ = 0xf3260988;
  auVar30._0_8_ = 0xf3260988f3260988;
  auVar30._12_4_ = 0xf3260988;
  auVar37 = pmaddwd(auVar72,auVar30);
  auVar79 = pmaddwd(auVar62,auVar30);
  auVar69._0_4_ = auVar26._0_4_ + 0x800 >> 0xc;
  auVar69._4_4_ = auVar26._4_4_ + 0x800 >> 0xc;
  auVar69._8_4_ = auVar26._8_4_ + 0x800 >> 0xc;
  auVar69._12_4_ = auVar26._12_4_ + 0x800 >> 0xc;
  auVar12._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar12._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar12._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar12._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  local_b8 = packssdw(auVar69,auVar12);
  auVar76._0_4_ = auVar37._0_4_ + 0x800 >> 0xc;
  auVar76._4_4_ = auVar37._4_4_ + 0x800 >> 0xc;
  auVar76._8_4_ = auVar37._8_4_ + 0x800 >> 0xc;
  auVar76._12_4_ = auVar37._12_4_ + 0x800 >> 0xc;
  auVar63._0_4_ = auVar79._0_4_ + 0x800 >> 0xc;
  auVar63._4_4_ = auVar79._4_4_ + 0x800 >> 0xc;
  auVar63._8_4_ = auVar79._8_4_ + 0x800 >> 0xc;
  auVar63._12_4_ = auVar79._12_4_ + 0x800 >> 0xc;
  local_a8 = packssdw(auVar76,auVar63);
  auVar67._0_12_ = alVar2._0_12_;
  auVar67._12_2_ = alVar2[0]._6_2_;
  auVar67._14_2_ = *(undefined2 *)((long)input[8] + 6);
  auVar66._12_4_ = auVar67._12_4_;
  auVar66._0_10_ = alVar2._0_10_;
  auVar66._10_2_ = *(undefined2 *)((long)input[8] + 4);
  auVar65._10_6_ = auVar66._10_6_;
  auVar65._0_8_ = alVar2[0];
  auVar65._8_2_ = alVar2[0]._4_2_;
  auVar64._8_8_ = auVar65._8_8_;
  auVar64._6_2_ = *(undefined2 *)((long)input[8] + 2);
  auVar64._4_2_ = alVar2[0]._2_2_;
  auVar64._0_2_ = (undefined2)alVar2[0];
  auVar64._2_2_ = (short)input[8][0];
  auVar54._2_2_ = (short)input[8][1];
  auVar54._0_2_ = (short)alVar2[1];
  auVar54._4_2_ = alVar2[1]._2_2_;
  auVar54._6_2_ = *(undefined2 *)((long)input[8] + 10);
  auVar54._8_2_ = alVar2[1]._4_2_;
  auVar54._10_2_ = *(undefined2 *)((long)input[8] + 0xc);
  auVar54._12_2_ = alVar2[1]._6_2_;
  auVar54._14_2_ = *(undefined2 *)((long)input[8] + 0xe);
  auVar13._8_4_ = 0xbdb0abf;
  auVar13._0_8_ = 0xbdb0abf0bdb0abf;
  auVar13._12_4_ = 0xbdb0abf;
  auVar26 = pmaddwd(auVar64,auVar13);
  auVar10 = pmaddwd(auVar13,auVar54);
  auVar31._8_4_ = 0xf5410bdb;
  auVar31._0_8_ = 0xf5410bdbf5410bdb;
  auVar31._12_4_ = 0xf5410bdb;
  auVar37 = pmaddwd(auVar64,auVar31);
  auVar79 = pmaddwd(auVar54,auVar31);
  auVar61._0_4_ = auVar26._0_4_ + 0x800 >> 0xc;
  auVar61._4_4_ = auVar26._4_4_ + 0x800 >> 0xc;
  auVar61._8_4_ = auVar26._8_4_ + 0x800 >> 0xc;
  auVar61._12_4_ = auVar26._12_4_ + 0x800 >> 0xc;
  auVar14._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar14._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar14._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar14._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  local_98 = packssdw(auVar61,auVar14);
  auVar68._0_4_ = auVar37._0_4_ + 0x800 >> 0xc;
  auVar68._4_4_ = auVar37._4_4_ + 0x800 >> 0xc;
  auVar68._8_4_ = auVar37._8_4_ + 0x800 >> 0xc;
  auVar68._12_4_ = auVar37._12_4_ + 0x800 >> 0xc;
  auVar55._0_4_ = auVar79._0_4_ + 0x800 >> 0xc;
  auVar55._4_4_ = auVar79._4_4_ + 0x800 >> 0xc;
  auVar55._8_4_ = auVar79._8_4_ + 0x800 >> 0xc;
  auVar55._12_4_ = auVar79._12_4_ + 0x800 >> 0xc;
  local_88 = packssdw(auVar68,auVar55);
  auVar59._0_12_ = alVar3._0_12_;
  auVar59._12_2_ = alVar3[0]._6_2_;
  auVar59._14_2_ = *(undefined2 *)((long)input[10] + 6);
  auVar58._12_4_ = auVar59._12_4_;
  auVar58._0_10_ = alVar3._0_10_;
  auVar58._10_2_ = *(undefined2 *)((long)input[10] + 4);
  auVar57._10_6_ = auVar58._10_6_;
  auVar57._0_8_ = alVar3[0];
  auVar57._8_2_ = alVar3[0]._4_2_;
  auVar56._8_8_ = auVar57._8_8_;
  auVar56._6_2_ = *(undefined2 *)((long)input[10] + 2);
  auVar56._4_2_ = alVar3[0]._2_2_;
  auVar56._0_2_ = (undefined2)alVar3[0];
  auVar56._2_2_ = (short)input[10][0];
  auVar42._2_2_ = (short)input[10][1];
  auVar42._0_2_ = (short)alVar3[1];
  auVar42._4_2_ = alVar3[1]._2_2_;
  auVar42._6_2_ = *(undefined2 *)((long)input[10] + 10);
  auVar42._8_2_ = alVar3[1]._4_2_;
  auVar42._10_2_ = *(undefined2 *)((long)input[10] + 0xc);
  auVar42._12_2_ = alVar3[1]._6_2_;
  auVar42._14_2_ = *(undefined2 *)((long)input[10] + 0xe);
  auVar15._8_4_ = 0xdb9083a;
  auVar15._0_8_ = 0xdb9083a0db9083a;
  auVar15._12_4_ = 0xdb9083a;
  auVar26 = pmaddwd(auVar56,auVar15);
  auVar10 = pmaddwd(auVar15,auVar42);
  auVar32._8_4_ = 0xf7c60db9;
  auVar32._0_8_ = 0xf7c60db9f7c60db9;
  auVar32._12_4_ = 0xf7c60db9;
  auVar37 = pmaddwd(auVar56,auVar32);
  auVar79 = pmaddwd(auVar42,auVar32);
  auVar53._0_4_ = auVar26._0_4_ + 0x800 >> 0xc;
  auVar53._4_4_ = auVar26._4_4_ + 0x800 >> 0xc;
  auVar53._8_4_ = auVar26._8_4_ + 0x800 >> 0xc;
  auVar53._12_4_ = auVar26._12_4_ + 0x800 >> 0xc;
  auVar16._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar16._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar16._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar16._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  local_78 = packssdw(auVar53,auVar16);
  cos_bit = '\x11';
  auVar60._0_4_ = auVar37._0_4_ + 0x800 >> 0xc;
  auVar60._4_4_ = auVar37._4_4_ + 0x800 >> 0xc;
  auVar60._8_4_ = auVar37._8_4_ + 0x800 >> 0xc;
  auVar60._12_4_ = auVar37._12_4_ + 0x800 >> 0xc;
  auVar43._0_4_ = auVar79._0_4_ + 0x800 >> 0xc;
  auVar43._4_4_ = auVar79._4_4_ + 0x800 >> 0xc;
  auVar43._8_4_ = auVar79._8_4_ + 0x800 >> 0xc;
  auVar43._12_4_ = auVar79._12_4_ + 0x800 >> 0xc;
  local_68 = packssdw(auVar60,auVar43);
  auVar47._0_12_ = alVar98._0_12_;
  auVar47._12_2_ = alVar98[0]._6_2_;
  auVar47._14_2_ = *(undefined2 *)((long)input[0xc] + 6);
  auVar46._12_4_ = auVar47._12_4_;
  auVar46._0_10_ = alVar98._0_10_;
  auVar46._10_2_ = *(undefined2 *)((long)input[0xc] + 4);
  auVar45._10_6_ = auVar46._10_6_;
  auVar45._0_8_ = alVar98[0];
  auVar45._8_2_ = alVar98[0]._4_2_;
  auVar44._8_8_ = auVar45._8_8_;
  auVar44._6_2_ = *(undefined2 *)((long)input[0xc] + 2);
  auVar44._4_2_ = alVar98[0]._2_2_;
  auVar44._0_2_ = (undefined2)alVar98[0];
  auVar44._2_2_ = (short)input[0xc][0];
  auVar39._2_2_ = (short)input[0xc][1];
  auVar39._0_2_ = (short)alVar98[1];
  auVar39._4_2_ = alVar98[1]._2_2_;
  auVar39._6_2_ = *(undefined2 *)((long)input[0xc] + 10);
  auVar39._8_2_ = alVar98[1]._4_2_;
  auVar39._10_2_ = *(undefined2 *)((long)input[0xc] + 0xc);
  auVar39._12_2_ = alVar98[1]._6_2_;
  auVar39._14_2_ = *(undefined2 *)((long)input[0xc] + 0xe);
  auVar17._8_4_ = 0xf110564;
  auVar17._0_8_ = 0xf1105640f110564;
  auVar17._12_4_ = 0xf110564;
  auVar37 = pmaddwd(auVar44,auVar17);
  auVar10 = pmaddwd(auVar17,auVar39);
  auVar33._8_4_ = 0xfa9c0f11;
  auVar33._0_8_ = 0xfa9c0f11fa9c0f11;
  auVar33._12_4_ = 0xfa9c0f11;
  auVar26 = pmaddwd(auVar44,auVar33);
  auVar79 = pmaddwd(auVar39,auVar33);
  auVar50._0_4_ = auVar37._0_4_ + 0x800 >> 0xc;
  auVar50._4_4_ = auVar37._4_4_ + 0x800 >> 0xc;
  auVar50._8_4_ = auVar37._8_4_ + 0x800 >> 0xc;
  auVar50._12_4_ = auVar37._12_4_ + 0x800 >> 0xc;
  auVar18._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar18._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar18._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar18._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  local_58 = packssdw(auVar50,auVar18);
  cospi = (int32_t *)0x259;
  lVar9 = 0x2590000;
  auVar48._0_4_ = auVar26._0_4_ + 0x800 >> 0xc;
  auVar48._4_4_ = auVar26._4_4_ + 0x800 >> 0xc;
  auVar48._8_4_ = auVar26._8_4_ + 0x800 >> 0xc;
  auVar48._12_4_ = auVar26._12_4_ + 0x800 >> 0xc;
  auVar40._0_4_ = auVar79._0_4_ + 0x800 >> 0xc;
  auVar40._4_4_ = auVar79._4_4_ + 0x800 >> 0xc;
  auVar40._8_4_ = auVar79._8_4_ + 0x800 >> 0xc;
  auVar40._12_4_ = auVar79._12_4_ + 0x800 >> 0xc;
  local_48 = packssdw(auVar48,auVar40);
  local_138 = (undefined2)lVar6;
  uStack_136 = (undefined2)((ulong)lVar6 >> 0x10);
  uStack_134 = (undefined2)((ulong)lVar6 >> 0x20);
  uStack_132 = (undefined2)((ulong)lVar6 >> 0x30);
  uStack_130 = (undefined2)lVar7;
  uStack_12e = (undefined2)((ulong)lVar7 >> 0x10);
  uStack_12c = (undefined2)((ulong)lVar7 >> 0x20);
  uStack_12a = (undefined2)((ulong)lVar7 >> 0x30);
  auVar22._0_12_ = alVar8._0_12_;
  auVar22._12_2_ = (short)((ulong)lVar4 >> 0x30);
  auVar22._14_2_ = uStack_132;
  auVar21._12_4_ = auVar22._12_4_;
  auVar21._0_10_ = alVar8._0_10_;
  auVar21._10_2_ = uStack_134;
  auVar20._10_6_ = auVar21._10_6_;
  auVar20._8_2_ = (short)((ulong)lVar4 >> 0x20);
  auVar20._0_8_ = lVar4;
  auVar19._8_8_ = auVar20._8_8_;
  auVar19._6_2_ = uStack_136;
  auVar19._4_2_ = (short)((ulong)lVar4 >> 0x10);
  auVar19._0_2_ = (undefined2)lVar4;
  auVar19._2_2_ = local_138;
  auVar51._2_2_ = uStack_130;
  auVar51._0_2_ = (short)lVar5;
  auVar51._4_2_ = (short)((ulong)lVar5 >> 0x10);
  auVar51._6_2_ = uStack_12e;
  auVar51._8_2_ = (short)((ulong)lVar5 >> 0x20);
  auVar51._10_2_ = uStack_12c;
  auVar51._12_2_ = (short)((ulong)lVar5 >> 0x30);
  auVar51._14_2_ = uStack_12a;
  auVar34._8_4_ = 0xfd40259;
  auVar34._0_8_ = 0xfd402590fd40259;
  auVar34._12_4_ = 0xfd40259;
  auVar26 = pmaddwd(auVar19,auVar34);
  auVar79 = pmaddwd(auVar34,auVar51);
  auVar41._8_4_ = 0xfda70fd4;
  auVar41._0_8_ = 0xfda70fd4fda70fd4;
  auVar41._12_4_ = 0xfda70fd4;
  auVar10 = pmaddwd(auVar19,auVar41);
  auVar37 = pmaddwd(auVar51,auVar41);
  auVar49._0_4_ = auVar26._0_4_ + 0x800 >> 0xc;
  auVar49._4_4_ = auVar26._4_4_ + 0x800 >> 0xc;
  auVar49._8_4_ = auVar26._8_4_ + 0x800 >> 0xc;
  auVar49._12_4_ = auVar26._12_4_ + 0x800 >> 0xc;
  auVar35._0_4_ = auVar79._0_4_ + 0x800 >> 0xc;
  auVar35._4_4_ = auVar79._4_4_ + 0x800 >> 0xc;
  auVar35._8_4_ = auVar79._8_4_ + 0x800 >> 0xc;
  auVar35._12_4_ = auVar79._12_4_ + 0x800 >> 0xc;
  local_38 = packssdw(auVar49,auVar35);
  auVar23._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar23._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar23._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar23._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  auVar52._0_4_ = auVar37._0_4_ + 0x800 >> 0xc;
  auVar52._4_4_ = auVar37._4_4_ + 0x800 >> 0xc;
  auVar52._8_4_ = auVar37._8_4_ + 0x800 >> 0xc;
  auVar52._12_4_ = auVar37._12_4_ + 0x800 >> 0xc;
  local_28 = packssdw(auVar23,auVar52);
  iadst16_stage3_ssse3(&local_118);
  alVar98[1] = lVar9;
  alVar98[0] = extraout_RDX;
  iadst16_stage4_ssse3(&local_118,cospi,alVar98,cos_bit);
  iadst16_stage5_ssse3(&local_118);
  alVar99[1] = lVar9;
  alVar99[0] = extraout_RDX_00;
  iadst16_stage6_ssse3(&local_118,cospi,alVar99,cos_bit);
  iadst16_stage7_ssse3(&local_118);
  alVar100[1] = lVar9;
  alVar100[0] = extraout_RDX_01;
  iadst16_stage8_ssse3(&local_118,cospi,alVar100,cos_bit);
  iadst16_stage9_ssse3(output,&local_118);
  return;
}

Assistant:

static void iadst16_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));
  const __m128i cospi_p02_p62 = pair_set_epi16(cospi[2], cospi[62]);
  const __m128i cospi_p62_m02 = pair_set_epi16(cospi[62], -cospi[2]);
  const __m128i cospi_p10_p54 = pair_set_epi16(cospi[10], cospi[54]);
  const __m128i cospi_p54_m10 = pair_set_epi16(cospi[54], -cospi[10]);
  const __m128i cospi_p18_p46 = pair_set_epi16(cospi[18], cospi[46]);
  const __m128i cospi_p46_m18 = pair_set_epi16(cospi[46], -cospi[18]);
  const __m128i cospi_p26_p38 = pair_set_epi16(cospi[26], cospi[38]);
  const __m128i cospi_p38_m26 = pair_set_epi16(cospi[38], -cospi[26]);
  const __m128i cospi_p34_p30 = pair_set_epi16(cospi[34], cospi[30]);
  const __m128i cospi_p30_m34 = pair_set_epi16(cospi[30], -cospi[34]);
  const __m128i cospi_p42_p22 = pair_set_epi16(cospi[42], cospi[22]);
  const __m128i cospi_p22_m42 = pair_set_epi16(cospi[22], -cospi[42]);
  const __m128i cospi_p50_p14 = pair_set_epi16(cospi[50], cospi[14]);
  const __m128i cospi_p14_m50 = pair_set_epi16(cospi[14], -cospi[50]);
  const __m128i cospi_p58_p06 = pair_set_epi16(cospi[58], cospi[6]);
  const __m128i cospi_p06_m58 = pair_set_epi16(cospi[6], -cospi[58]);

  // stage 1
  __m128i x[16];
  x[0] = input[15];
  x[1] = input[0];
  x[2] = input[13];
  x[3] = input[2];
  x[4] = input[11];
  x[5] = input[4];
  x[6] = input[9];
  x[7] = input[6];
  x[8] = input[7];
  x[9] = input[8];
  x[10] = input[5];
  x[11] = input[10];
  x[12] = input[3];
  x[13] = input[12];
  x[14] = input[1];
  x[15] = input[14];

  // stage 2
  btf_16_sse2(cospi_p02_p62, cospi_p62_m02, x[0], x[1], x[0], x[1]);
  btf_16_sse2(cospi_p10_p54, cospi_p54_m10, x[2], x[3], x[2], x[3]);
  btf_16_sse2(cospi_p18_p46, cospi_p46_m18, x[4], x[5], x[4], x[5]);
  btf_16_sse2(cospi_p26_p38, cospi_p38_m26, x[6], x[7], x[6], x[7]);
  btf_16_sse2(cospi_p34_p30, cospi_p30_m34, x[8], x[9], x[8], x[9]);
  btf_16_sse2(cospi_p42_p22, cospi_p22_m42, x[10], x[11], x[10], x[11]);
  btf_16_sse2(cospi_p50_p14, cospi_p14_m50, x[12], x[13], x[12], x[13]);
  btf_16_sse2(cospi_p58_p06, cospi_p06_m58, x[14], x[15], x[14], x[15]);

  // stage 3~9
  iadst16_stage3_ssse3(x);
  iadst16_stage4_ssse3(x, cospi, __rounding, cos_bit);
  iadst16_stage5_ssse3(x);
  iadst16_stage6_ssse3(x, cospi, __rounding, cos_bit);
  iadst16_stage7_ssse3(x);
  iadst16_stage8_ssse3(x, cospi, __rounding, cos_bit);
  iadst16_stage9_ssse3(output, x);
}